

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void wasm::FunctionValidator::scan(FunctionValidator *self,Expression **currp)

{
  Expression *parent;
  Function *pFVar1;
  Expression **currp_00;
  Id IVar2;
  Index IVar3;
  Expression ***pppEVar4;
  ulong uVar5;
  PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *this;
  Index index;
  long lVar6;
  bool result;
  bool bVar7;
  AbstractChildIterator<wasm::ChildIterator> local_78;
  Expression **local_38;
  
  parent = *currp;
  if (parent->_id == TryId) {
    this = &(self->
            super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
            ).
            super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
    ;
    local_38 = currp;
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&this->
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
                doVisitTry,currp);
    if (parent->_id == TryId) {
      if (0 < (int)(uint)*(undefined8 *)(parent + 5)) {
        uVar5 = (ulong)((uint)*(undefined8 *)(parent + 5) & 0x7fffffff);
        lVar6 = uVar5 * 8;
        uVar5 = uVar5 + 1;
        do {
          lVar6 = lVar6 + -8;
          if (*(ulong *)(parent + 5) <= uVar5 - 2) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
                    (&this->
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     ,scan,(Expression **)(parent[4].type.id + lVar6));
          uVar5 = uVar5 - 1;
        } while (1 < uVar5);
      }
      currp_00 = local_38;
      Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
                (&this->
                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 ,visitPreCatch,local_38);
      if (parent->_id == TryId) {
        Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
                  (&this->
                    super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   ,scan,(Expression **)(parent + 2));
        Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
                  (&this->
                    super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   ,visitPreTry,currp_00);
        return;
      }
    }
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,"T *wasm::Expression::cast() [T = wasm::Try]");
  }
  PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::scan
            (self,currp);
  IVar2 = parent->_id;
  if (IVar2 == BlockId) {
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                ).
                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                .
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,visitPreBlock,currp);
    IVar2 = parent->_id;
  }
  if (IVar2 == LoopId) {
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                ).
                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                .
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,visitPreLoop,currp);
  }
  pFVar1 = (self->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
           ).
           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           currFunction;
  if ((pFVar1 != (Function *)0x0) && (pFVar1->profile == Poppy)) {
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                ).
                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                .
                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               ,visitPoppyExpression,currp);
  }
  if ((parent->type).id != 1) {
    return;
  }
  IVar2 = parent->_id;
  uVar5 = (ulong)IVar2;
  if (uVar5 < 0x3e) {
    if ((0x1c0000000880000U >> (uVar5 & 0x3f) & 1) != 0) {
      return;
    }
    if (uVar5 == 7) {
      IVar2 = parent[5]._id;
    }
    else {
      if (uVar5 != 0x3d) goto LAB_00cc783d;
      IVar2 = (Id)parent[3].type.id;
    }
  }
  else {
LAB_00cc783d:
    if (IVar2 - 4 < 2) {
      return;
    }
    if (IVar2 != CallId) goto LAB_00cc7863;
    IVar2 = parent[4]._id;
  }
  if (IVar2 != InvalidId) {
    return;
  }
LAB_00cc7863:
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_78,parent);
  local_78.children.usedFixed._0_4_ =
       (int)((ulong)((long)local_78.children.flexible.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_78.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) +
       (int)local_78.children.usedFixed;
  if ((int)local_78.children.usedFixed == 0) {
    result = false;
  }
  else {
    index = 0;
    do {
      IVar3 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_78,index);
      pppEVar4 = local_78.children.flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar3 - 4);
      if (IVar3 < 4) {
        pppEVar4 = local_78.children.fixed._M_elems + IVar3;
      }
      result = ((**pppEVar4)->type).id == 1;
    } while ((!result) &&
            (bVar7 = (int)local_78.children.usedFixed - 1U != index, index = index + 1, bVar7));
  }
  if (local_78.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ValidationInfo::shouldBeTrue<wasm::Expression*>
            (self->info,result,parent,"unreachable instruction must have unreachable child",
             (self->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  return;
}

Assistant:

static void scan(FunctionValidator* self, Expression** currp) {
    auto* curr = *currp;
    // Treat 'Try' specially because we need to run visitPreCatch between the
    // try body and catch bodies
    if (curr->is<Try>()) {
      self->pushTask(doVisitTry, currp);
      auto& list = curr->cast<Try>()->catchBodies;
      for (int i = int(list.size()) - 1; i >= 0; i--) {
        self->pushTask(scan, &list[i]);
      }
      self->pushTask(visitPreCatch, currp);
      self->pushTask(scan, &curr->cast<Try>()->body);
      self->pushTask(visitPreTry, currp);
      return;
    }

    PostWalker<FunctionValidator>::scan(self, currp);

    if (curr->is<Block>()) {
      self->pushTask(visitPreBlock, currp);
    }
    if (curr->is<Loop>()) {
      self->pushTask(visitPreLoop, currp);
    }
    if (auto* func = self->getFunction()) {
      if (func->profile == IRProfile::Poppy) {
        self->pushTask(visitPoppyExpression, currp);
      }
    }

    // Also verify that only allowed expressions end up in the situation where
    // the expression has type unreachable but there is no unreachable child.
    // For example a Call with no unreachable child cannot be unreachable, but a
    // Break can be.
    if (curr->type == Type::unreachable) {
      switch (curr->_id) {
        case Expression::BreakId: {
          // If there is a condition, that is already validated fully in
          // visitBreak(). If there isn't a condition, then this is allowed to
          // be unreachable even without an unreachable child. Either way, we
          // can leave.
          return;
        }
        case Expression::SwitchId:
        case Expression::ReturnId:
        case Expression::UnreachableId:
        case Expression::ThrowId:
        case Expression::RethrowId:
        case Expression::ThrowRefId: {
          // These can all be unreachable without an unreachable child.
          return;
        }
        case Expression::CallId: {
          if (curr->cast<Call>()->isReturn) {
            return;
          }
          break;
        }
        case Expression::CallIndirectId: {
          if (curr->cast<CallIndirect>()->isReturn) {
            return;
          }
          break;
        }
        case Expression::CallRefId: {
          if (curr->cast<CallRef>()->isReturn) {
            return;
          }
          break;
        }
        default: {
          break;
        }
      }

      // If we reach here, then we must have an unreachable child.
      bool hasUnreachableChild = false;
      for (auto* child : ChildIterator(curr)) {
        if (child->type == Type::unreachable) {
          hasUnreachableChild = true;
          break;
        }
      }
      self->shouldBeTrue(hasUnreachableChild,
                         curr,
                         "unreachable instruction must have unreachable child");
    }
  }